

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

int __thiscall common::Config::Init(Config *this,string *config_file)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  istream *piVar4;
  long lVar5;
  ulong uVar6;
  size_type sVar7;
  Host *this_00;
  reference pvVar8;
  element_type *peVar9;
  Log *pLVar10;
  char cVar11;
  size_type local_3f0;
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [32];
  undefined1 local_348 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  undefined1 local_310 [8];
  shared_ptr<common::Host> host;
  string local_2f8 [32];
  undefined1 local_2d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [8];
  string s;
  allocator local_241;
  string local_240 [8];
  string group;
  istream local_220 [8];
  ifstream infile;
  string *config_file_local;
  Config *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::data();
  std::ifstream::ifstream(local_220,pcVar3,_S_in);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,anon_var_dwarf_e6 + 0xc,&local_241);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_group_names,(value_type *)local_240);
  std::__cxx11::string::string(local_278);
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_278);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar1) break;
    xlib::Trim((string *)local_278);
    lVar5 = std::__cxx11::string::size();
    if ((lVar5 != 0) && (lVar5 = std::__cxx11::string::find((char)local_278,0x23), lVar5 != 0)) {
      uVar6 = std::__cxx11::string::size();
      if ((uVar6 < 3) ||
         ((lVar5 = std::__cxx11::string::find((char)local_278,0x5b), lVar5 != 0 ||
          (lVar5 = std::__cxx11::string::find((char)local_278,0x5d), lVar5 == 0)))) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_2f8," ",
                   (allocator *)
                   ((long)&host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        xlib::Split((string *)local_278,(string *)local_2f8,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2d8);
        std::__cxx11::string::~string(local_2f8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2d8);
        if (sVar7 < 5) {
          pLVar10 = xlib::Log::Instance();
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3b8,"ignore %v",&local_3b9);
          xlib::Log::SWrite<std::__cxx11::string>
                    (pLVar10,LOG_PRIORITY_DEBUG,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/config.cc"
                     ,0x35,"Init",true,(string *)local_3b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278)
          ;
          std::__cxx11::string::~string(local_3b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        }
        else {
          this_00 = (Host *)operator_new(0xc0);
          Host::Host(this_00);
          std::shared_ptr<common::Host>::shared_ptr<common::Host,void>
                    ((shared_ptr<common::Host> *)local_310,this_00);
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_2d8,0);
          peVar9 = std::__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_310);
          std::__cxx11::string::operator=((string *)peVar9,(string *)pvVar8);
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_2d8,1);
          peVar9 = std::__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_310);
          std::__cxx11::string::operator=((string *)&peVar9->ip,(string *)pvVar8);
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_2d8,2);
          peVar9 = std::__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_310);
          std::__cxx11::string::operator=((string *)&peVar9->user,(string *)pvVar8);
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_2d8,3);
          peVar9 = std::__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_310);
          std::__cxx11::string::operator=((string *)&peVar9->password,(string *)pvVar8);
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_2d8,4);
          std::__cxx11::string::string
                    ((string *)
                     &tags.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar8);
          iVar2 = xlib::Stoi((string *)
                             &tags.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          peVar9 = std::__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_310);
          peVar9->port = (uint16_t)iVar2;
          std::__cxx11::string::~string
                    ((string *)
                     &tags.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_348);
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2d8);
          if (5 < sVar7) {
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_2d8,5);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_368,"|",&local_369);
            xlib::Split(pvVar8,(string *)local_368,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_348);
            std::__cxx11::string::~string(local_368);
            std::allocator<char>::~allocator((allocator<char> *)&local_369);
          }
          peVar9 = std::__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_310);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&peVar9->tags,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_348);
          peVar9 = std::__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_310);
          std::__cxx11::string::operator=((string *)&peVar9->group,local_240);
          std::
          vector<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>::
          push_back(&this->m_hosts,(value_type *)local_310);
          pLVar10 = xlib::Log::Instance();
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_390,"add host %v in group %v",&local_391);
          peVar9 = std::__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_310);
          xlib::Log::SWrite<std::__cxx11::string,std::__cxx11::string>
                    (pLVar10,LOG_PRIORITY_DEBUG,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/config.cc"
                     ,0x33,"Init",true,(string *)local_390,&peVar9->alias,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240)
          ;
          std::__cxx11::string::~string(local_390);
          std::allocator<char>::~allocator((allocator<char> *)&local_391);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_348);
          std::shared_ptr<common::Host>::~shared_ptr((shared_ptr<common::Host> *)local_310);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2d8);
      }
      else {
        cVar11 = (char)local_278;
        std::__cxx11::string::find(cVar11,0x5b);
        std::__cxx11::string::find(cVar11,0x5d);
        std::__cxx11::string::substr((ulong)local_298,(ulong)local_278);
        std::__cxx11::string::operator=(local_240,local_298);
        std::__cxx11::string::~string(local_298);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->m_group_names,(value_type *)local_240);
        pLVar10 = xlib::Log::Instance();
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_2b8,"set group %v",
                   (allocator *)
                   ((long)&vec.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        xlib::Log::SWrite<std::__cxx11::string>
                  (pLVar10,LOG_PRIORITY_DEBUG,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/config.cc"
                   ,0x1f,"Init",true,(string *)local_2b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
        std::__cxx11::string::~string(local_2b8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&vec.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
    }
  }
  pLVar10 = xlib::Log::Instance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"read host num %v ",&local_3e1);
  local_3f0 = std::
              vector<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
              ::size(&this->m_hosts);
  xlib::Log::SWrite<unsigned_long>
            (pLVar10,LOG_PRIORITY_DEBUG,
             "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/config.cc"
             ,0x38,"Init",true,(string *)local_3e0,&local_3f0);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  std::ifstream::close();
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_240);
  std::ifstream::~ifstream(local_220);
  return 0;
}

Assistant:

int Config::Init(const std::string& config_file) {
    std::ifstream infile(config_file.data());

    std::string group("");
    m_group_names.push_back(group);
    std::string s;
    while (getline(infile, s)) {
        xlib::Trim(s);
        if (s.size() == 0 || s.find('#') == 0) {
            continue;
        }

        if (s.size() > 2 && s.find('[') == 0 && s.find(']') > 0) {
            group = s.substr(s.find('[')+1, s.find(']')-1);
            m_group_names.push_back(group);
            XDBG("set group %v", group);
            continue;
        }
        std::vector<std::string> vec;
        xlib::Split(s, " ",  &vec);
        if (vec.size() >= 5) {
            cxx::shared_ptr<Host> host(new Host);
            host->alias = vec[0];
            host->ip    = vec[1];
            host->user  = vec[2];
            host->password = vec[3];
            host->port     = static_cast<uint32_t>(xlib::Stoi(vec[4]));

            std::vector<std::string> tags;
            if (vec.size() >= 6) {
                xlib::Split(vec[5], "|", &tags);
            }
            host->tags = tags;
            host->group = group;
            m_hosts.push_back(host);
            XDBG("add host %v in group %v", host->alias, group);
        } else {
            XDBG("ignore %v", s);
        }
    }
    XDBG("read host num %v ", m_hosts.size());
    infile.close();
    return 0;
}